

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int * Abc_NtkSimulateOneNode(Abc_Ntk_t *pNtk,int *pModel,int input,Vec_Ptr_t **topOrder)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int *piVar7;
  void *pvVar8;
  int local_4c;
  int i;
  int Value1;
  int Value0;
  int *pValues;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode;
  Vec_Ptr_t **topOrder_local;
  int input_local;
  int *pModel_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(0x32);
  Abc_NtkIncrementTravId(pNtk);
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  pAVar5 = Abc_NtkCi(pNtk,input);
  (pAVar5->field_6).iTemp = pModel[input];
  local_4c = Vec_PtrSize(topOrder[input]);
  while (local_4c = local_4c + -1, -1 < local_4c) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(topOrder[input],local_4c);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    aVar1 = pAVar6->field_6;
    uVar2 = Abc_ObjFaninC0(pAVar5);
    uVar2 = aVar1.iTemp ^ uVar2;
    pAVar6 = Abc_ObjFanin1(pAVar5);
    aVar1 = pAVar6->field_6;
    uVar3 = Abc_ObjFaninC1(pAVar5);
    uVar3 = aVar1.iTemp ^ uVar3;
    if ((pAVar5->field_6).iTemp != (uVar2 & uVar3)) {
      (pAVar5->field_6).iTemp = uVar2 & uVar3;
      Vec_PtrPush(p,pAVar5);
    }
  }
  iVar4 = Abc_NtkCoNum(pNtk);
  piVar7 = (int *)malloc((long)iVar4 << 2);
  for (local_4c = 0; iVar4 = Abc_NtkCoNum(pNtk), local_4c < iVar4; local_4c = local_4c + 1) {
    pAVar5 = Abc_NtkCo(pNtk,local_4c);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    aVar1 = pAVar6->field_6;
    uVar2 = Abc_ObjFaninC0(pAVar5);
    piVar7[local_4c] = aVar1.iTemp ^ uVar2;
  }
  pAVar5 = Abc_NtkCi(pNtk,input);
  if ((pAVar5->field_6).pTemp == (void *)0x1) {
    (pAVar5->field_6).pTemp = (void *)0x0;
  }
  else {
    pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  }
  for (local_4c = 0; iVar4 = Vec_PtrSize(p), local_4c < iVar4; local_4c = local_4c + 1) {
    pvVar8 = Vec_PtrEntry(p,local_4c);
    if (*(long *)((long)pvVar8 + 0x40) == 1) {
      *(undefined8 *)((long)pvVar8 + 0x40) = 0;
    }
    else {
      *(undefined8 *)((long)pvVar8 + 0x40) = 1;
    }
  }
  Vec_PtrFree(p);
  return piVar7;
}

Assistant:

int * Abc_NtkSimulateOneNode( Abc_Ntk_t * pNtk, int * pModel, int input, Vec_Ptr_t ** topOrder )
{
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int * pValues, Value0, Value1, i;
   
    vNodes = Vec_PtrAlloc( 50 );
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values     
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    pNode = Abc_NtkCi(pNtk, input);
    pNode->iTemp = pModel[input];
    
    // simulate in the topological order    
    for(i = Vec_PtrSize(topOrder[input])-1; i >= 0; i--)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(topOrder[input], i);        
        
        Value0 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ Abc_ObjFaninC1(pNode);
        
        if( pNode->iTemp != (Value0 & Value1))
        {
            pNode->iTemp = (Value0 & Value1);
            Vec_PtrPush(vNodes, pNode);
        }
    
    }    
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
    
    pNode = Abc_NtkCi(pNtk, input);
    if(pNode->pCopy == (Abc_Obj_t *)1)
        pNode->pCopy = (Abc_Obj_t *)0;
    else
        pNode->pCopy = (Abc_Obj_t *)1;

    for(i = 0; i < Vec_PtrSize(vNodes); i++)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i);

        if(pNode->pCopy == (Abc_Obj_t *)1)
            pNode->pCopy = (Abc_Obj_t *)0;
        else
            pNode->pCopy = (Abc_Obj_t *)1;
    }

    Vec_PtrFree( vNodes );

    return pValues;
}